

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_conv_2d_dw(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  void *pvVar10;
  void *pvVar11;
  undefined1 (*pauVar12) [64];
  undefined1 auVar13 [16];
  char cVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  void *pvVar21;
  long lVar22;
  long lVar23;
  undefined1 (*pauVar24) [64];
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  char *pcVar28;
  long lVar29;
  undefined1 (*pauVar30) [64];
  undefined1 (*pauVar31) [64];
  long lVar32;
  ulong uVar33;
  undefined8 uVar34;
  long lVar35;
  long lVar36;
  undefined1 (*pauVar37) [64];
  undefined1 (*pauVar38) [64];
  undefined1 (*pauVar39) [64];
  long lVar40;
  long lVar41;
  long lVar42;
  int64_t knl_x;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  undefined1 auVar47 [64];
  int64_t c;
  long local_130;
  long local_128;
  long local_108;
  undefined1 (*local_f8) [64];
  undefined1 (*local_b0) [64];
  
  pgVar1 = dst->src[0];
  pgVar2 = dst->src[1];
  uVar3 = pgVar2->ne[2];
  if (pgVar1->ne[3] == uVar3) {
    lVar32 = pgVar2->ne[3];
    if (dst->ne[3] == lVar32) {
      lVar4 = pgVar2->ne[0];
      lVar5 = pgVar2->ne[1];
      lVar6 = dst->ne[0];
      lVar7 = dst->ne[1];
      lVar8 = pgVar1->ne[0];
      lVar9 = pgVar1->ne[1];
      lVar15 = (long)dst->op_params[0];
      lVar16 = (long)dst->op_params[1];
      lVar17 = (long)dst->op_params[2];
      lVar18 = (long)dst->op_params[3];
      lVar42 = (long)dst->op_params[4];
      lVar19 = (long)dst->op_params[5];
      cVar14 = ggml_is_contiguous(pgVar2);
      if (cVar14 == '\0') {
        cVar14 = ggml_is_contiguous_channels(pgVar2);
        if (cVar14 == '\0') {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
                     ,0x185b,"non-contiguous memory layout not supported");
        }
        if ((pgVar1->nb[0] < pgVar1->nb[2]) || (pgVar1->nb[1] < pgVar1->nb[0])) {
          pcVar28 = "kernel->nb[0] >= kernel->nb[2] && kernel->nb[1] >= kernel->nb[0]";
          uVar34 = 0x1858;
          goto LAB_00142690;
        }
        lVar32 = lVar32 * lVar7;
        lVar20 = (lVar32 + -1 + (long)params->nth) / (long)params->nth;
        lVar40 = params->ith * lVar20;
        lVar20 = lVar20 + lVar40;
        if (lVar32 <= lVar20) {
          lVar20 = lVar32;
        }
        uVar33 = uVar3 + 0xf;
        if (-1 < (long)uVar3) {
          uVar33 = uVar3;
        }
        if (lVar40 < lVar20) {
          pauVar12 = (undefined1 (*) [64])pgVar1->data;
          uVar26 = uVar33 & 0xfffffffffffffff0;
          lVar32 = lVar8 * uVar3 * 4;
          lVar35 = uVar3 * lVar15 * 4;
          lVar29 = lVar4 * uVar3 * lVar19 * 4;
          lVar25 = uVar3 * lVar42 * 4;
          do {
            if (0 < lVar6) {
              lVar41 = (lVar40 % lVar7) * lVar16 - lVar18;
              local_f8 = (undefined1 (*) [64])
                         (((lVar16 * 4 * (lVar40 % lVar7) + lVar18 * -4 +
                           (lVar40 / lVar7) * lVar5 * 4) * lVar4 + lVar17 * -4) * uVar3 +
                         (long)pgVar2->data);
              local_b0 = local_f8 + ((long)uVar33 >> 4);
              lVar43 = 0;
              local_108 = -lVar17;
              do {
                lVar44 = (lVar43 + lVar40 * lVar6) * uVar3;
                pvVar10 = dst->data;
                if (0xf < (long)uVar3) {
                  lVar23 = 0;
                  pauVar30 = local_f8;
                  pauVar38 = pauVar12;
                  do {
                    auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
                    if (0 < lVar9) {
                      lVar22 = 0;
                      pauVar31 = pauVar30;
                      pauVar39 = pauVar38;
                      do {
                        lVar36 = lVar22 * lVar19 + lVar41;
                        pauVar24 = pauVar31;
                        pauVar37 = pauVar39;
                        lVar46 = local_108;
                        lVar45 = lVar8;
                        if ((-1 < lVar36 && 0 < lVar8) && lVar36 < lVar5) {
                          do {
                            if (lVar46 < lVar4 && -1 < lVar46) {
                              auVar47 = vfmadd231ps_avx512f(auVar47,*pauVar37,*pauVar24);
                            }
                            lVar45 = lVar45 + -1;
                            pauVar24 = (undefined1 (*) [64])(*pauVar24 + lVar25);
                            pauVar37 = (undefined1 (*) [64])(*pauVar37 + uVar3 * 4);
                            lVar46 = lVar46 + lVar42;
                          } while (lVar45 != 0);
                        }
                        lVar22 = lVar22 + 1;
                        pauVar39 = (undefined1 (*) [64])(*pauVar39 + lVar32);
                        pauVar31 = (undefined1 (*) [64])(*pauVar31 + lVar29);
                      } while (lVar22 != lVar9);
                    }
                    *(undefined1 (*) [64])((long)pvVar10 + lVar23 * 4 + lVar44 * 4) = auVar47;
                    lVar23 = lVar23 + 0x10;
                    pauVar38 = pauVar38 + 1;
                    pauVar30 = pauVar30 + 1;
                  } while (lVar23 < (long)uVar26);
                }
                uVar27 = uVar26;
                pauVar30 = local_b0;
                pauVar38 = pauVar12 + ((long)uVar33 >> 4);
                if ((long)uVar26 < (long)uVar3) {
                  do {
                    auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
                    if (0 < lVar9) {
                      lVar23 = 0;
                      pauVar31 = pauVar30;
                      pauVar39 = pauVar38;
                      do {
                        lVar45 = lVar23 * lVar19 + lVar41;
                        pauVar24 = pauVar31;
                        lVar22 = local_108;
                        pauVar37 = pauVar39;
                        lVar46 = lVar8;
                        if ((-1 < lVar45 && 0 < lVar8) && lVar45 < lVar5) {
                          do {
                            if (lVar22 < lVar4 && -1 < lVar22) {
                              auVar13 = vfmadd231ss_fma(auVar47._0_16_,ZEXT416(*(uint *)*pauVar37),
                                                        ZEXT416(*(uint *)*pauVar24));
                              auVar47 = ZEXT1664(auVar13);
                            }
                            lVar46 = lVar46 + -1;
                            pauVar24 = (undefined1 (*) [64])(*pauVar24 + lVar25);
                            lVar22 = lVar22 + lVar42;
                            pauVar37 = (undefined1 (*) [64])(*pauVar37 + uVar3 * 4);
                          } while (lVar46 != 0);
                        }
                        lVar23 = lVar23 + 1;
                        pauVar39 = (undefined1 (*) [64])(*pauVar39 + lVar32);
                        pauVar31 = (undefined1 (*) [64])(*pauVar31 + lVar29);
                      } while (lVar23 != lVar9);
                    }
                    *(int *)((long)pvVar10 + uVar27 * 4 + lVar44 * 4) = auVar47._0_4_;
                    uVar27 = uVar27 + 1;
                    pauVar38 = (undefined1 (*) [64])(*pauVar38 + 4);
                    pauVar30 = (undefined1 (*) [64])(*pauVar30 + 4);
                  } while (uVar27 != uVar3);
                }
                lVar43 = lVar43 + 1;
                local_f8 = (undefined1 (*) [64])(*local_f8 + lVar35);
                local_108 = local_108 + lVar15;
                local_b0 = (undefined1 (*) [64])(*local_b0 + lVar35);
              } while (lVar43 != lVar6);
            }
            lVar40 = lVar40 + 1;
          } while (lVar40 != lVar20);
        }
      }
      else {
        lVar32 = lVar32 * uVar3;
        lVar20 = (lVar32 + -1 + (long)params->nth) / (long)params->nth;
        lVar40 = lVar20 * params->ith;
        if (lVar40 + lVar20 < lVar32) {
          lVar32 = lVar40 + lVar20;
        }
        if (lVar40 < lVar32) {
          pvVar10 = pgVar1->data;
          pvVar11 = dst->data;
          local_f8 = (undefined1 (*) [64])
                     ((lVar20 * lVar5 * (long)params->ith * 4 + lVar18 * -4) * lVar4 + lVar17 * -4 +
                     (long)pgVar2->data);
          do {
            if (0 < lVar7) {
              local_128 = (long)local_f8;
              local_130 = 0;
              do {
                if (0 < lVar6) {
                  lVar29 = 0;
                  lVar20 = local_128;
                  lVar35 = -lVar17;
                  do {
                    auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
                    if (0 < lVar9) {
                      lVar41 = 0;
                      pvVar21 = (void *)((long)pvVar10 + (lVar40 % (long)uVar3) * lVar9 * lVar8 * 4)
                      ;
                      lVar25 = lVar20;
                      do {
                        lVar43 = lVar41 * lVar19 + (local_130 * lVar16 - lVar18);
                        if ((-1 < lVar43 && 0 < lVar8) && lVar43 < lVar5) {
                          lVar43 = 0;
                          lVar44 = 0;
                          do {
                            if (lVar35 + lVar43 < lVar4 && -1 < lVar35 + lVar43) {
                              auVar13 = vfmadd231ss_fma(auVar47._0_16_,
                                                        ZEXT416(*(uint *)((long)pvVar21 + lVar44 * 4
                                                                         )),
                                                        ZEXT416(*(uint *)(lVar25 + lVar43 * 4)));
                              auVar47 = ZEXT1664(auVar13);
                            }
                            lVar44 = lVar44 + 1;
                            lVar43 = lVar43 + lVar42;
                          } while (lVar8 != lVar44);
                        }
                        lVar41 = lVar41 + 1;
                        pvVar21 = (void *)((long)pvVar21 + lVar8 * 4);
                        lVar25 = lVar25 + lVar19 * lVar4 * 4;
                      } while (lVar41 != lVar9);
                    }
                    *(int *)((long)pvVar11 +
                            lVar29 * 4 + local_130 * lVar6 * 4 + lVar7 * lVar6 * lVar40 * 4) =
                         auVar47._0_4_;
                    lVar29 = lVar29 + 1;
                    lVar35 = lVar35 + lVar15;
                    lVar20 = lVar20 + lVar15 * 4;
                  } while (lVar29 != lVar6);
                }
                local_130 = local_130 + 1;
                local_128 = local_128 + lVar4 * lVar16 * 4;
              } while (local_130 != lVar7);
            }
            lVar40 = lVar40 + 1;
            local_f8 = (undefined1 (*) [64])((long)local_f8 + lVar5 * lVar4 * 4);
          } while (lVar40 != lVar32);
        }
      }
      return;
    }
    pcVar28 = "dst->ne[3] == p.batch";
    uVar34 = 0x1852;
  }
  else {
    pcVar28 = "kernel->ne[3] == p.channels";
    uVar34 = 0x1851;
  }
LAB_00142690:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar34,"GGML_ASSERT(%s) failed",pcVar28);
}

Assistant:

void ggml_compute_forward_conv_2d_dw(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * kernel = dst->src[0];
    const ggml_tensor * src = dst->src[1];
    ggml_conv_2d_dw_params p;
    p.channels = src->ne[2];
    p.batch = src->ne[3];
    p.src_w = src->ne[0];
    p.src_h = src->ne[1];
    p.dst_w = dst->ne[0];
    p.dst_h = dst->ne[1];
    p.knl_w = kernel->ne[0];
    p.knl_h = kernel->ne[1];
    p.stride_x = dst->op_params[0];
    p.stride_y = dst->op_params[1];
    p.pad_x = dst->op_params[2];
    p.pad_y = dst->op_params[3];
    p.dilation_x = dst->op_params[4];
    p.dilation_y = dst->op_params[5];

    GGML_ASSERT(kernel->ne[3] == p.channels);
    GGML_ASSERT(dst->ne[3] == p.batch);

    if (ggml_is_contiguous(src)) {
        ggml_compute_forward_conv_2d_dw_whcn(params, src, kernel, dst, p);
    } else if (ggml_is_contiguous_channels(src)) {
        // kernel should also have channels most contiguous in memory
        GGML_ASSERT(kernel->nb[0] >= kernel->nb[2] && kernel->nb[1] >= kernel->nb[0]);
        ggml_compute_forward_conv_2d_dw_cwhn(params, src, kernel, dst, p);
    } else {
        GGML_ABORT("non-contiguous memory layout not supported");
    }
}